

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

int bufs_ensure_addb(nghttp2_bufs *bufs)

{
  uint8_t **ppuVar1;
  nghttp2_buf_chain *pnVar2;
  size_t sVar3;
  int iVar4;
  nghttp2_buf_chain *pnStack_10;
  
  if ((bufs->cur->buf).end != (bufs->cur->buf).last) {
    return 0;
  }
  pnVar2 = bufs->cur->next;
  if (pnVar2 == (nghttp2_buf_chain *)0x0) {
    if (bufs->max_chunk == bufs->chunk_used) {
      return -0x1f6;
    }
    iVar4 = buf_chain_new(&pnStack_10,bufs->chunk_length,bufs->mem);
    if (iVar4 != 0) {
      return iVar4;
    }
    bufs->chunk_used = bufs->chunk_used + 1;
    bufs->cur->next = pnStack_10;
    bufs->cur = pnStack_10;
    sVar3 = bufs->offset;
    ppuVar1 = &(pnStack_10->buf).pos;
    *ppuVar1 = *ppuVar1 + sVar3;
    ppuVar1 = &(pnStack_10->buf).last;
    *ppuVar1 = *ppuVar1 + sVar3;
  }
  else {
    bufs->cur = pnVar2;
  }
  return 0;
}

Assistant:

static int bufs_ensure_addb(nghttp2_bufs *bufs) {
  int rv;
  nghttp2_buf *buf;

  buf = &bufs->cur->buf;

  if (nghttp2_buf_avail(buf) > 0) {
    return 0;
  }

  rv = bufs_alloc_chain(bufs);
  if (rv != 0) {
    return rv;
  }

  return 0;
}